

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShow.c
# Opt level: O3

void Gia_ManShow(Gia_Man_t *pMan,Vec_Int_t *vBold,int fAdders,int fFadds,int fPath)

{
  Vec_Int_t *vAdds;
  char *__src;
  FILE *__stream;
  char FileNameDot [200];
  Vec_Int_t *local_108;
  int local_fc;
  char local_f8 [200];
  
  local_108 = (Vec_Int_t *)0x0;
  local_fc = fFadds;
  if (fAdders == 0) {
    vAdds = (Vec_Int_t *)0x0;
  }
  else {
    vAdds = Ree_ManComputeCuts(pMan,&local_108,0);
  }
  __src = Extra_FileNameGenericAppend(pMan->pName,".dot");
  strcpy(local_f8,__src);
  __stream = fopen(local_f8,"w");
  if (__stream == (FILE *)0x0) {
    fprintf(_stdout,"Cannot open the intermediate file \"%s\".\n",local_f8);
  }
  else {
    fclose(__stream);
    if (fPath == 0) {
      if (fAdders == 0) {
        Gia_WriteDotAigSimple(pMan,local_f8,vBold);
      }
      else {
        Gia_ShowProcess(pMan,local_f8,vBold,vAdds,local_108,local_fc);
      }
    }
    else {
      Gia_ShowPath(pMan,local_f8);
    }
    Abc_ShowFile(local_f8);
    if (vAdds != (Vec_Int_t *)0x0) {
      if (vAdds->pArray != (int *)0x0) {
        free(vAdds->pArray);
      }
      free(vAdds);
    }
    if (local_108 != (Vec_Int_t *)0x0) {
      if (local_108->pArray != (int *)0x0) {
        free(local_108->pArray);
        local_108->pArray = (int *)0x0;
      }
      free(local_108);
    }
  }
  return;
}

Assistant:

void Gia_ManShow( Gia_Man_t * pMan, Vec_Int_t * vBold, int fAdders, int fFadds, int fPath )
{
    extern void Abc_ShowFile( char * FileNameDot );
    char FileNameDot[200];
    FILE * pFile;
    Vec_Int_t * vXors = NULL, * vAdds = fAdders ? Ree_ManComputeCuts( pMan, &vXors, 0 ) : NULL;
    sprintf( FileNameDot, "%s", Extra_FileNameGenericAppend(pMan->pName, ".dot") );
    // check that the file can be opened
    if ( (pFile = fopen( FileNameDot, "w" )) == NULL )
    {
        fprintf( stdout, "Cannot open the intermediate file \"%s\".\n", FileNameDot );
        return;
    }
    fclose( pFile );
    // generate the file
    if ( fPath )
        Gia_ShowPath( pMan, FileNameDot );
    else if ( fAdders )
        Gia_ShowProcess( pMan, FileNameDot, vBold, vAdds, vXors, fFadds );
    else
        Gia_WriteDotAigSimple( pMan, FileNameDot, vBold );
    // visualize the file 
    Abc_ShowFile( FileNameDot );

    Vec_IntFreeP( &vAdds );
    Vec_IntFreeP( &vXors );
}